

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O3

void yactfr::internal::anon_unknown_23::validateNoMappedClkTypeId(PseudoDt *basePseudoDt)

{
  string msg;
  TextLocation loc;
  PredFunc *in_RCX;
  Set pseudoDts;
  undefined8 in_stack_ffffffffffffff50;
  _func_int **pp_Var1;
  undefined8 uVar2;
  code *pcVar3;
  undefined1 local_88 [48];
  undefined1 local_58 [16];
  _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_48;
  
  uVar2 = 0;
  pp_Var1 = (_func_int **)&stack0xffffffffffffff57;
  local_88._24_8_ =
       std::
       _Function_handler<bool_(const_yactfr::internal::PseudoDt_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/pseudo-dt-utils.hpp:36:40)>
       ::_M_invoke;
  local_88._8_8_ = 0;
  local_88._16_8_ =
       std::
       _Function_handler<bool_(const_yactfr::internal::PseudoDt_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/pseudo-dt-utils.hpp:36:40)>
       ::_M_manager;
  pcVar3 = (code *)0x0;
  local_88._0_8_ = pp_Var1;
  commonFindPseudoDts<yactfr::internal::PseudoDtFinder<yactfr::internal::ConstPseudoDtVisitor>,yactfr::internal::PseudoDt_const>
            ((Set *)&local_48,(internal *)basePseudoDt,(PseudoDt *)local_88,in_RCX);
  if ((code *)local_88._16_8_ != (code *)0x0) {
    (*(code *)local_88._16_8_)(local_88,local_88,3);
    if (pcVar3 != (code *)0x0) {
      (*pcVar3)(&stack0xffffffffffffff58,&stack0xffffffffffffff58,3);
    }
  }
  if (local_48._M_element_count == 0) {
    std::
    _Hashtable<const_yactfr::internal::PseudoDt_*,_const_yactfr::internal::PseudoDt_*,_std::allocator<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Identity,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_48);
    return;
  }
  local_88._32_8_ = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_88 + 0x20),
             "At least one fixed-length unsigned integer type is mapped to a clock type; this isn\'t not supported within this scope."
             ,"");
  msg.field_2._8_8_ = in_stack_ffffffffffffff50;
  msg._0_24_ = basePseudoDt->_loc;
  loc._lineNumber = uVar2;
  loc._offset = (Index)pp_Var1;
  loc._colNumber = (Index)pcVar3;
  throwTextParseError(msg,loc);
}

Assistant:

auto validateNoMappedClkTypeId(const PseudoDt& basePseudoDt)
{
    const auto pseudoDts = findPseudoUIntTypes(basePseudoDt, [](auto& pseudoIntType, auto) {
        if (!isFlUIntNotDtWrapper(pseudoIntType)) {
            return false;
        }

        return static_cast<const PseudoFlUIntType&>(pseudoIntType).mappedClkTypeId().has_value();
    });

    if (!pseudoDts.empty()) {
        throwTextParseError("At least one fixed-length unsigned integer type "
                            "is mapped to a clock type; "
                            "this isn't not supported within this scope.",
                            basePseudoDt.loc());
    }
}